

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseCVQualifiers(State *state)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  State *in_RDI;
  int num_cv_qualifiers;
  ComplexityGuard guard;
  int local_20;
  ComplexityGuard local_18;
  char one_char_token;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar4;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_18,in_RDI);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_18);
  if (bVar1) {
    bVar4 = false;
  }
  else {
    local_20 = 0;
    while( true ) {
      bVar1 = ParseExtendedQualifier
                        ((State *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      one_char_token = (char)((ulong)in_RDI >> 0x38);
      if (!bVar1) break;
      local_20 = local_20 + 1;
    }
    bVar1 = ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                              ,one_char_token);
    bVar2 = ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                              ,one_char_token);
    bVar3 = ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                              ,one_char_token);
    bVar4 = 0 < (int)((uint)bVar3 + local_20 + (uint)bVar1 + (uint)bVar2);
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_18);
  return (bool)(bVar4 & 1);
}

Assistant:

static bool ParseCVQualifiers(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  int num_cv_qualifiers = 0;
  while (ParseExtendedQualifier(state)) ++num_cv_qualifiers;
  num_cv_qualifiers += ParseOneCharToken(state, 'r');
  num_cv_qualifiers += ParseOneCharToken(state, 'V');
  num_cv_qualifiers += ParseOneCharToken(state, 'K');
  return num_cv_qualifiers > 0;
}